

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFtpCommand.cpp
# Opt level: O0

int __thiscall CTYPECommand::doWhat(CTYPECommand *this,CClient *pClient)

{
  bool bVar1;
  EFTPSTATE EVar2;
  allocator local_c9;
  undefined1 local_c8 [8];
  string ret_3;
  undefined1 local_a0 [8];
  string ret_2;
  undefined1 local_78 [8];
  string ret_1;
  allocator local_41;
  undefined1 local_40 [8];
  string ret;
  CClient *pClient_local;
  CTYPECommand *this_local;
  
  ret.field_2._8_8_ = pClient;
  EVar2 = CClient::GetClientState(pClient);
  if ((int)EVar2 < 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_c8,"530 Please login with USER and PASS.\r\n",&local_c9);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    CClient::sendMsg((CClient *)ret.field_2._8_8_,(string *)local_c8);
    this_local._4_4_ = -1;
    std::__cxx11::string::~string((string *)local_c8);
  }
  else {
    bVar1 = std::operator==(&(this->super_CCommand).m_Args,"I");
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_40,"200 Switching to Binary mode.\r\n",&local_41)
      ;
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
      CClient::sendMsg((CClient *)ret.field_2._8_8_,(string *)local_40);
      this_local._4_4_ = 1;
      std::__cxx11::string::~string((string *)local_40);
    }
    else {
      bVar1 = std::operator==(&(this->super_CCommand).m_Args,"A");
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_78,"200 Switching to ASCII mode.\r\n",
                   (allocator *)(ret_2.field_2._M_local_buf + 0xf));
        std::allocator<char>::~allocator((allocator<char> *)(ret_2.field_2._M_local_buf + 0xf));
        CClient::sendMsg((CClient *)ret.field_2._8_8_,(string *)local_78);
        this_local._4_4_ = 1;
        std::__cxx11::string::~string((string *)local_78);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_a0,"500 Unrecognised TYPE command.\r\n",
                   (allocator *)(ret_3.field_2._M_local_buf + 0xf));
        std::allocator<char>::~allocator((allocator<char> *)(ret_3.field_2._M_local_buf + 0xf));
        CClient::sendMsg((CClient *)ret.field_2._8_8_,(string *)local_a0);
        this_local._4_4_ = -1;
        std::__cxx11::string::~string((string *)local_a0);
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int CTYPECommand::doWhat(CClient *pClient) {
    if(pClient->GetClientState() >= PASS){
        if(m_Args == "I"){
            string ret = "200 Switching to Binary mode.\r\n";
            pClient->sendMsg(ret);
            return 1;
        }
        else if(m_Args == "A"){
            string ret = "200 Switching to ASCII mode.\r\n";
            pClient->sendMsg(ret);
            return 1;
        }
        // there should have some orther type mode.
        else{
            string ret = "500 Unrecognised TYPE command.\r\n";
            pClient->sendMsg(ret);
            return -1;
        }
    }
    else{
        string ret = "530 Please login with USER and PASS.\r\n";
        pClient->sendMsg(ret);
        return -1;
    }
}